

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_uuid.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::uuid_rule::string_value(uuid_rule *this,string *v)

{
  undefined8 uVar1;
  bool bVar2;
  uuid *puVar3;
  uuid *puVar4;
  error_code eVar5;
  undefined1 local_39 [8];
  maybe<pstore::uuid,_void> value;
  string *v_local;
  uuid_rule *this_local;
  error_category *local_10;
  
  value.storage_._8_8_ = v;
  uuid::from_string((maybe<pstore::uuid,_void> *)local_39,v);
  bVar2 = maybe::operator_cast_to_bool((maybe *)local_39);
  if (bVar2) {
    puVar3 = maybe<pstore::uuid,_void>::operator*((maybe<pstore::uuid,_void> *)local_39);
    puVar4 = gsl::not_null::operator_cast_to_uuid_((not_null *)&this->v_);
    uVar1 = *(undefined8 *)((puVar3->data_)._M_elems + 8);
    *(undefined8 *)(puVar4->data_)._M_elems = *(undefined8 *)(puVar3->data_)._M_elems;
    *(undefined8 *)((puVar4->data_)._M_elems + 8) = uVar1;
    eVar5 = rule::pop(&this->super_rule);
    local_10 = eVar5._M_cat;
    this_local._0_4_ = eVar5._M_value;
  }
  maybe<pstore::uuid,_void>::~maybe((maybe<pstore::uuid,_void> *)local_39);
  if (!bVar2) {
    std::error_code::error_code<pstore::exchange::import_ns::error,void>
              ((error_code *)&this_local,bad_uuid);
  }
  eVar5._4_4_ = 0;
  eVar5._M_value = (uint)this_local;
  eVar5._M_cat = local_10;
  return eVar5;
}

Assistant:

std::error_code uuid_rule::string_value (std::string const & v) {
                if (maybe<uuid> const value = uuid::from_string (v)) {
                    *v_ = *value;
                    return pop ();
                }
                return error::bad_uuid;
            }